

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.h
# Opt level: O0

string * __thiscall
glslang::TSourceLoc::getStringNameOrNum_abi_cxx11_
          (string *__return_storage_ptr__,TSourceLoc *this,bool quoteStringName)

{
  char *__s;
  allocator<char> local_73;
  undefined1 local_72;
  byte local_71;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_70;
  undefined1 local_48 [8];
  TString qstr;
  bool quoteStringName_local;
  TSourceLoc *this_local;
  string *ret_str;
  
  qstr.field_2._M_local_buf[0xf] = quoteStringName;
  if (this->name == (TString *)0x0) {
    std::__cxx11::to_string(__return_storage_ptr__,(long)this->string);
  }
  else {
    local_71 = 0;
    if (quoteStringName) {
      std::operator+(&local_70,"\"",this->name);
      local_71 = 1;
      std::operator+((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                     local_48,&local_70,"\"");
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                   local_48,this->name);
    }
    if ((local_71 & 1) != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string(&local_70);
    }
    local_72 = 0;
    __s = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          c_str((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                local_48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,&local_73);
    std::allocator<char>::~allocator(&local_73);
    local_72 = 1;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                  local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getStringNameOrNum(bool quoteStringName = true) const
    {
        if (name != nullptr) {
            TString qstr = quoteStringName ? ("\"" + *name + "\"") : *name;
            std::string ret_str(qstr.c_str());
            return ret_str;
        }
        return std::to_string((long long)string);
    }